

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::clear
          (SmallVectorBase<slang::analysis::DataFlowState> *this)

{
  SmallVectorBase<slang::analysis::DataFlowState> *in_RDI;
  __destroy_fn *unaff_retaddr;
  
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<slang::analysis::DataFlowState>_&>
            (unaff_retaddr,in_RDI);
  in_RDI->len = 0;
  return;
}

Assistant:

void clear() noexcept {
        std::ranges::destroy(*this);
        len = 0;
    }